

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdgif.c
# Opt level: O2

void ReadColorMap(gif_source_ptr sinfo,int cmaplen,JSAMPARRAY cmap)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)cmaplen;
  if (cmaplen < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    iVar1 = ReadByte(sinfo);
    (*cmap)[uVar2] = (JSAMPLE)iVar1;
    iVar1 = ReadByte(sinfo);
    cmap[1][uVar2] = (JSAMPLE)iVar1;
    iVar1 = ReadByte(sinfo);
    cmap[2][uVar2] = (JSAMPLE)iVar1;
  }
  return;
}

Assistant:

LOCAL(void)
ReadColorMap(gif_source_ptr sinfo, int cmaplen, JSAMPARRAY cmap)
/* Read a GIF colormap */
{
  int i;

  for (i = 0; i < cmaplen; i++) {
#if BITS_IN_JSAMPLE == 8
#define UPSCALE(x)  (x)
#else
#define UPSCALE(x)  ((x) << (BITS_IN_JSAMPLE - 8))
#endif
    cmap[CM_RED][i]   = (JSAMPLE)UPSCALE(ReadByte(sinfo));
    cmap[CM_GREEN][i] = (JSAMPLE)UPSCALE(ReadByte(sinfo));
    cmap[CM_BLUE][i]  = (JSAMPLE)UPSCALE(ReadByte(sinfo));
  }
}